

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O2

void mat4x4_look_at(vec4 *m,float *eye,float *center,float *up)

{
  int i;
  long lVar1;
  float *pfVar2;
  long lVar3;
  float p;
  float fVar4;
  vec3 f;
  vec4 r;
  vec3 s;
  ulong local_68;
  float local_60;
  undefined4 local_5c;
  float local_54 [8];
  float local_34;
  float local_30;
  float local_2c;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    local_54[lVar1] = center[lVar1] - eye[lVar1];
  }
  vec3_norm(local_54,local_54);
  vec3_mul_cross(&local_34,local_54,up);
  vec3_norm(&local_34,&local_34);
  (*m)[0] = local_34;
  (*m)[1] = local_30 * local_54[2] - local_54[1] * local_2c;
  (*m)[2] = -local_54[0];
  (*m)[3] = 0.0;
  m[1][0] = local_30;
  m[1][1] = local_2c * local_54[0] - local_54[2] * local_34;
  m[1][2] = -local_54[1];
  m[1][3] = 0.0;
  m[2][0] = local_2c;
  m[2][1] = local_34 * local_54[1] - local_54[0] * local_30;
  m[2][2] = -local_54[2];
  *(undefined8 *)(m[2] + 3) = 0;
  *(float *)((long)(m + 3) + 4) = 0.0;
  *(float *)((long)(m + 3) + 8) = 0.0;
  m[3][3] = 1.0;
  local_68 = *(ulong *)eye ^ 0x8000000080000000;
  local_60 = -eye[2];
  local_5c = 0;
  lVar1 = 0;
  pfVar2 = *m;
  for (; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
      *(float *)((long)local_54 + lVar3 + 0xc) = pfVar2[lVar3];
    }
    fVar4 = 0.0;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar4 = fVar4 + *(float *)((long)&local_68 + lVar3 * 4) * local_54[lVar3 + 3];
    }
    m[3][lVar1] = fVar4 + m[3][lVar1];
    pfVar2 = pfVar2 + 1;
  }
  return;
}

Assistant:

static inline void mat4x4_look_at(mat4x4 m, vec3 eye, vec3 center, vec3 up)
{
	/* Adapted from Android's OpenGL Matrix.java.                        */
	/* See the OpenGL GLUT documentation for gluLookAt for a description */
	/* of the algorithm. We implement it in a straightforward way:       */

	/* TODO: The negation of of can be spared by swapping the order of
	 *       operands in the following cross products in the right way. */
	vec3 f;
	vec3_sub(f, center, eye);	
	vec3_norm(f, f);	
	
	vec3 s;
	vec3_mul_cross(s, f, up);
	vec3_norm(s, s);

	vec3 t;
	vec3_mul_cross(t, s, f);

	m[0][0] =  s[0];
	m[0][1] =  t[0];
	m[0][2] = -f[0];
	m[0][3] =   0.f;

	m[1][0] =  s[1];
	m[1][1] =  t[1];
	m[1][2] = -f[1];
	m[1][3] =   0.f;

	m[2][0] =  s[2];
	m[2][1] =  t[2];
	m[2][2] = -f[2];
	m[2][3] =   0.f;

	m[3][0] =  0.f;
	m[3][1] =  0.f;
	m[3][2] =  0.f;
	m[3][3] =  1.f;

	mat4x4_translate_in_place(m, -eye[0], -eye[1], -eye[2]);
}